

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O0

void hsluv2rgb(double h,double s,double l,double *pr,double *pg,double *pb)

{
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  Triplet tmp;
  double local_78;
  double local_70;
  double local_68;
  Triplet *in_stack_ffffffffffffffa0;
  double local_58;
  Triplet *in_stack_ffffffffffffffb0;
  
  hsluv2lch(in_stack_ffffffffffffffa0);
  lch2luv(in_stack_ffffffffffffffa0);
  luv2xyz(in_stack_ffffffffffffffb0);
  xyz2rgb(in_stack_ffffffffffffffa0);
  if (0.0 <= in_XMM0_Qa) {
    local_58 = in_XMM0_Qa;
    if (1.0 < in_XMM0_Qa) {
      local_58 = 1.0;
    }
  }
  else {
    local_58 = 0.0;
  }
  *in_RDI = local_58;
  if (0.0 <= in_XMM1_Qa) {
    local_68 = in_XMM1_Qa;
    if (1.0 < in_XMM1_Qa) {
      local_68 = 1.0;
    }
  }
  else {
    local_68 = 0.0;
  }
  *in_RSI = local_68;
  if (0.0 <= in_XMM2_Qa) {
    local_78 = in_XMM2_Qa;
    if (1.0 < in_XMM2_Qa) {
      local_78 = 1.0;
    }
    local_70 = local_78;
  }
  else {
    local_70 = 0.0;
  }
  *in_RDX = local_70;
  return;
}

Assistant:

void
hsluv2rgb(double h, double s, double l, double* pr, double* pg, double* pb)
{
    Triplet tmp = { h, s, l };

    hsluv2lch(&tmp);
    lch2luv(&tmp);
    luv2xyz(&tmp);
    xyz2rgb(&tmp);

    *pr = CLAMP(tmp.a, 0.0, 1.0);
    *pg = CLAMP(tmp.b, 0.0, 1.0);
    *pb = CLAMP(tmp.c, 0.0, 1.0);
}